

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O2

void luaK_ret(FuncState *fs,int first,int nret)

{
  uint uVar1;
  
  uVar1 = 0x47;
  if (nret != 0) {
    uVar1 = (uint)(nret == 1) * 2 + 0x46;
  }
  luaK_code(fs,first << 7 | uVar1 | nret * 0x10000 + 0x10000U);
  return;
}

Assistant:

void luaK_ret (FuncState *fs, int first, int nret) {
  OpCode op;
  switch (nret) {
    case 0: op = OP_RETURN0; break;
    case 1: op = OP_RETURN1; break;
    default: op = OP_RETURN; break;
  }
  luaK_codeABC(fs, op, first, nret + 1, 0);
}